

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

bool __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue_for
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *popped_item,
          milliseconds wait_duration)

{
  bool bVar1;
  async_msg *paVar2;
  anon_class_8_1_8991fb9c in_RSI;
  async_msg *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  condition_variable *in_stack_ffffffffffffffd8;
  byte local_1;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffff98);
  bVar1 = std::condition_variable::
          wait_for<long,std::ratio<1l,1000l>,spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue_for(spdlog::details::async_msg&,std::chrono::duration<long,std::ratio<1l,1000l>>)::_lambda()_1_>
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_RDI,in_RSI);
  if (bVar1) {
    paVar2 = circular_q<spdlog::details::async_msg>::front
                       ((circular_q<spdlog::details::async_msg> *)0x258cdb);
    async_msg::operator=(in_RDI,paVar2);
    circular_q<spdlog::details::async_msg>::pop_front
              ((circular_q<spdlog::details::async_msg> *)
               ((in_RDI->super_log_msg_buffer).buffer.store_ + 8));
  }
  else {
    local_1 = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  if (bVar1) {
    std::condition_variable::notify_one();
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool dequeue_for(T &popped_item, std::chrono::milliseconds wait_duration)
    {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            if (!push_cv_.wait_for(lock, wait_duration, [this] { return !this->q_.empty(); }))
            {
                return false;
            }
            popped_item = std::move(q_.front());
            q_.pop_front();
        }
        pop_cv_.notify_one();
        return true;
    }